

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcrypt_pbkdf.c
# Opt level: O0

int bcrypt_pbkdf(char *pass,size_t passlen,uint8_t *salt,size_t saltlen,uint8_t *key,size_t keylen,
                uint rounds)

{
  int iVar1;
  EVP_MD_CTX *pEVar2;
  ulong local_158;
  size_t dest;
  EVP_MD_CTX *ctx;
  size_t origkeylen;
  ulong uStack_130;
  uint32_t count;
  size_t stride;
  size_t amt;
  size_t j;
  size_t i;
  uint8_t *countsalt;
  uint8_t tmpout [32];
  uint8_t out [32];
  uint8_t sha2salt [64];
  uint8_t sha2pass [64];
  ulong local_40;
  size_t keylen_local;
  uint8_t *key_local;
  size_t saltlen_local;
  uint8_t *salt_local;
  size_t passlen_local;
  char *pass_local;
  
  if (rounds == 0) {
    pass_local._4_4_ = -1;
  }
  else if ((((passlen == 0) || (saltlen == 0)) || (keylen == 0)) ||
          ((0x400 < keylen || (0x100000 < saltlen)))) {
    pass_local._4_4_ = -1;
  }
  else {
    ctx = (EVP_MD_CTX *)keylen;
    i = (size_t)calloc(1,saltlen + 4);
    if ((void *)i == (void *)0x0) {
      pass_local._4_4_ = -1;
    }
    else {
      uStack_130 = keylen + 0x1f >> 5;
      stride = ((keylen + uStack_130) - 1) / uStack_130;
      memcpy((void *)i,salt,saltlen);
      iVar1 = _libssh2_sha512_init((EVP_MD_CTX **)&dest);
      if (((iVar1 == 0) ||
          (iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&dest,pass,passlen), iVar1 == 0)) ||
         (iVar1 = _libssh2_sha512_final((EVP_MD_CTX **)&dest,sha2salt + 0x38), iVar1 == 0)) {
        free((void *)i);
        pass_local._4_4_ = -1;
      }
      else {
        origkeylen._4_4_ = 1;
        for (local_40 = keylen; local_40 != 0; local_40 = local_40 - j) {
          *(char *)(i + saltlen) = (char)((uint)origkeylen._4_4_ >> 0x18);
          *(char *)(i + 1 + saltlen) = (char)((uint)origkeylen._4_4_ >> 0x10);
          *(char *)(i + 2 + saltlen) = (char)((uint)origkeylen._4_4_ >> 8);
          *(char *)(i + 3 + saltlen) = (char)origkeylen._4_4_;
          iVar1 = _libssh2_sha512_init((EVP_MD_CTX **)&dest);
          if (((iVar1 == 0) ||
              (iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&dest,(void *)i,saltlen + 4),
              iVar1 == 0)) ||
             (iVar1 = _libssh2_sha512_final((EVP_MD_CTX **)&dest,out + 0x18), iVar1 == 0)) {
            explicit_bzero(tmpout + 0x18,0x20);
            free((void *)i);
            return -1;
          }
          bcrypt_hash(sha2salt + 0x38,out + 0x18,(uint8_t *)&countsalt);
          tmpout._24_8_ = countsalt;
          out[0] = tmpout[0];
          out[1] = tmpout[1];
          out[2] = tmpout[2];
          out[3] = tmpout[3];
          out[4] = tmpout[4];
          out[5] = tmpout[5];
          out[6] = tmpout[6];
          out[7] = tmpout[7];
          out[8] = tmpout[8];
          out[9] = tmpout[9];
          out[10] = tmpout[10];
          out[0xb] = tmpout[0xb];
          out[0xc] = tmpout[0xc];
          out[0xd] = tmpout[0xd];
          out[0xe] = tmpout[0xe];
          out[0xf] = tmpout[0xf];
          out[0x10] = tmpout[0x10];
          out[0x11] = tmpout[0x11];
          out[0x12] = tmpout[0x12];
          out[0x13] = tmpout[0x13];
          out[0x14] = tmpout[0x14];
          out[0x15] = tmpout[0x15];
          out[0x16] = tmpout[0x16];
          out[0x17] = tmpout[0x17];
          for (j = 1; j < rounds; j = j + 1) {
            iVar1 = _libssh2_sha512_init((EVP_MD_CTX **)&dest);
            if (((iVar1 == 0) ||
                (iVar1 = _libssh2_sha512_update((EVP_MD_CTX **)&dest,&countsalt,0x20), iVar1 == 0))
               || (iVar1 = _libssh2_sha512_final((EVP_MD_CTX **)&dest,out + 0x18), iVar1 == 0)) {
              explicit_bzero(tmpout + 0x18,0x20);
              free((void *)i);
              return -1;
            }
            bcrypt_hash(sha2salt + 0x38,out + 0x18,(uint8_t *)&countsalt);
            for (amt = 0; amt < 0x20; amt = amt + 1) {
              tmpout[amt + 0x18] = tmpout[amt + 0x18] ^ tmpout[amt - 8];
            }
          }
          if (stride < local_40) {
            local_158 = stride;
          }
          else {
            local_158 = local_40;
          }
          stride = local_158;
          for (j = 0; (j < local_158 &&
                      (pEVar2 = (EVP_MD_CTX *)(j * uStack_130 + (ulong)(origkeylen._4_4_ - 1)),
                      pEVar2 < ctx)); j = j + 1) {
            key[(long)pEVar2] = tmpout[j + 0x18];
          }
          origkeylen._4_4_ = origkeylen._4_4_ + 1;
        }
        explicit_bzero(tmpout + 0x18,0x20);
        free((void *)i);
        pass_local._4_4_ = 0;
      }
    }
  }
  return pass_local._4_4_;
}

Assistant:

static int
bcrypt_pbkdf(const char *pass, size_t passlen, const uint8_t *salt,
             size_t saltlen,
             uint8_t *key, size_t keylen, unsigned int rounds)
{
    uint8_t sha2pass[SHA512_DIGEST_LENGTH];
    uint8_t sha2salt[SHA512_DIGEST_LENGTH];
    uint8_t out[BCRYPT_HASHSIZE];
    uint8_t tmpout[BCRYPT_HASHSIZE];
    uint8_t *countsalt;
    size_t i, j, amt, stride;
    uint32_t count;
    size_t origkeylen = keylen;
    libssh2_sha512_ctx ctx;

    /* nothing crazy */
    if(rounds < 1)
        return -1;
    if(passlen == 0 || saltlen == 0 || keylen == 0 ||
       keylen > sizeof(out) * sizeof(out) || saltlen > 1<<20)
        return -1;
    countsalt = calloc(1, saltlen + 4);
    if(!countsalt)
        return -1;
    stride = (keylen + sizeof(out) - 1) / sizeof(out);
    amt = (keylen + stride - 1) / stride;

    memcpy(countsalt, salt, saltlen);

    /* collapse password */
    if(!libssh2_sha512_init(&ctx) ||
       !libssh2_sha512_update(ctx, pass, passlen) ||
       !libssh2_sha512_final(ctx, sha2pass)) {
        free(countsalt);
        return -1;
    }

    /* generate key, sizeof(out) at a time */
    for(count = 1; keylen > 0; count++) {
        countsalt[saltlen + 0] = (uint8_t)((count >> 24) & 0xff);
        countsalt[saltlen + 1] = (count >> 16) & 0xff;
        countsalt[saltlen + 2] = (count >> 8) & 0xff;
        countsalt[saltlen + 3] = count & 0xff;

        /* first round, salt is salt */
        if(!libssh2_sha512_init(&ctx) ||
           !libssh2_sha512_update(ctx, countsalt, saltlen + 4) ||
           !libssh2_sha512_final(ctx, sha2salt)) {
            _libssh2_explicit_zero(out, sizeof(out));
            free(countsalt);
            return -1;
        }

        bcrypt_hash(sha2pass, sha2salt, tmpout);
        memcpy(out, tmpout, sizeof(out));

        for(i = 1; i < rounds; i++) {
            /* subsequent rounds, salt is previous output */
            if(!libssh2_sha512_init(&ctx) ||
               !libssh2_sha512_update(ctx, tmpout, sizeof(tmpout)) ||
               !libssh2_sha512_final(ctx, sha2salt)) {
                _libssh2_explicit_zero(out, sizeof(out));
                free(countsalt);
                return -1;
            }

            bcrypt_hash(sha2pass, sha2salt, tmpout);
            for(j = 0; j < sizeof(out); j++)
                out[j] ^= tmpout[j];
        }

        /*
         * pbkdf2 deviation: output the key material non-linearly.
         */
        amt = LIBSSH2_MIN(amt, keylen);
        for(i = 0; i < amt; i++) {
            size_t dest = i * stride + (count - 1);
            if(dest >= origkeylen) {
                break;
            }
            key[dest] = out[i];
        }
        keylen -= i;
    }

    /* zap */
    _libssh2_explicit_zero(out, sizeof(out));
    free(countsalt);

    return 0;
}